

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O0

void Rotate(vec2 *pCenter,vec2 *pPoint,float Rotation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float y;
  float x;
  
  fVar1 = *in_RSI;
  fVar2 = *in_RDI;
  fVar3 = in_RSI[1];
  fVar4 = in_RDI[1];
  fVar5 = cosf(in_XMM0_Da);
  fVar6 = sinf(in_XMM0_Da);
  *in_RSI = (fVar1 - fVar2) * fVar5 + -((fVar3 - fVar4) * fVar6) + *in_RDI;
  fVar5 = sinf(in_XMM0_Da);
  fVar6 = cosf(in_XMM0_Da);
  in_RSI[1] = (fVar1 - fVar2) * fVar5 + (fVar3 - fVar4) * fVar6 + in_RDI[1];
  return;
}

Assistant:

void Rotate(vec2 *pCenter, vec2 *pPoint, float Rotation)
{
	float x = pPoint->x - pCenter->x;
	float y = pPoint->y - pCenter->y;
	pPoint->x = x * cosf(Rotation) - y * sinf(Rotation) + pCenter->x;
	pPoint->y = x * sinf(Rotation) + y * cosf(Rotation) + pCenter->y;
}